

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

int __thiscall
ON_MappingTag::Compare
          (ON_MappingTag *this,ON_MappingTag *other,bool bCompareId,bool bCompareCRC,
          bool bCompareXform)

{
  int iVar1;
  undefined7 in_register_00000011;
  
  iVar1 = 0;
  if ((int)CONCAT71(in_register_00000011,bCompareId) != 0) {
    iVar1 = ON_UuidCompare(&this->m_mapping_id,&other->m_mapping_id);
  }
  if (bCompareCRC && iVar1 == 0) {
    if (this->m_mapping_crc < other->m_mapping_crc) {
      return -1;
    }
    if (other->m_mapping_crc < this->m_mapping_crc) {
      return 1;
    }
  }
  if (!bCompareXform || iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ON_Xform::Compare(&this->m_mesh_xform,&other->m_mesh_xform);
  return iVar1;
}

Assistant:

int ON_MappingTag::Compare( 
             const ON_MappingTag& other,
             bool bCompareId,
             bool bCompareCRC,
             bool bCompareXform
             ) const
{
  int rc = 0;
  if ( !rc && bCompareId )
  {
    rc = ON_UuidCompare(m_mapping_id,other.m_mapping_id);
  }
  if ( !rc && bCompareCRC )
  {
    if (m_mapping_crc < other.m_mapping_crc)
      return -1;
    if (m_mapping_crc > other.m_mapping_crc)
      return 1;
  }
  if ( !rc && bCompareXform )
  {
    rc = m_mesh_xform.Compare(other.m_mesh_xform);
  }
  return rc;
}